

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_compliance_ut.c
# Opt level: O0

int pal_temperature_get_with_null_pointer_fail(void)

{
  pal_result pVar1;
  uint local_c;
  pal_result result;
  
  printf("Execute test pal_temperature_get_with_null_pointer_fail\r\n");
  pVar1 = pal_temperature_get((unsigned_short *)0x0);
  if (pVar1 == PAL_ERROR_ARG) {
    printf("Succeeded\r\n\r\n");
  }
  else {
    printf("pal_temperature_get return failed. Expected:PAL_ERROR_ARG Actual:%u\r\n\r\n",
           (ulong)pVar1);
  }
  local_c = (uint)(pVar1 != PAL_ERROR_ARG);
  return local_c;
}

Assistant:

int pal_temperature_get_with_null_pointer_fail(void) {
    printf("Execute test pal_temperature_get_with_null_pointer_fail\r\n");
    ///arrange

    ///act
    pal_result result = pal_temperature_get(NULL);

    ///assert
    if (result != PAL_ERROR_ARG) {
        printf("pal_temperature_get return failed. Expected:PAL_ERROR_ARG Actual:%u\r\n\r\n", result);
        return 1;
    }
    printf("Succeeded\r\n\r\n");
    return 0;
}